

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O2

CallResultWrap * tapi_cancel_order1(void *h,char *account_id,char *code,char *entrust_no)

{
  CallResultWrap *this;
  char *pcVar1;
  CallResult<bool> r;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  CallResult<bool> local_48;
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string(local_68,account_id,&local_a9);
    std::__cxx11::string::string(local_88,code,&local_aa);
    std::__cxx11::string::string(local_a8,entrust_no,&local_ab);
    (**(code **)(*h + 0x60))(&local_48,h,local_68,local_88,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    this = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(this);
    if (local_48.value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pcVar1 = _T(&local_48.msg,&this->_msg);
      this->msg = pcVar1;
    }
    else {
      std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
      this->value = (this->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this->element_size = 1;
      this->element_count = 1;
      this->value_type = 0xb;
    }
    tquant::api::CallResult<bool>::~CallResult(&local_48);
    return this;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x18a,
                "CallResultWrap *tapi_cancel_order1(void *, const char *, const char *, const char *)"
               );
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_cancel_order1(void* h, const char* account_id,
                                   const char* code,
                                   const char* entrust_no)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->cancel_order(account_id, code, entrust_no);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
        cr->bool_value = r.value;
        cr->value = reinterpret_cast<const void*>(cr->bool_value.get());
        cr->element_size = sizeof(bool);
        cr->element_count = 1;
        cr->value_type = VT_BOOL;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}